

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int acmod_best_score(acmod_t *acmod,int *out_best_senid)

{
  byte bVar1;
  short sVar2;
  bin_mdef_t *pbVar3;
  uint8 *puVar4;
  int iVar5;
  int iVar6;
  int16 *piVar7;
  long lVar8;
  
  if (acmod->compallsen == '\0') {
    iVar6 = acmod->n_senone_active;
    if (iVar6 < 1) {
      return 0x7fff;
    }
    piVar7 = acmod->senone_scores;
    puVar4 = acmod->senone_active;
    iVar5 = 0x7fff;
    lVar8 = 0;
    do {
      bVar1 = puVar4[lVar8];
      sVar2 = piVar7[bVar1];
      if (sVar2 < iVar5) {
        *out_best_senid = (int)lVar8;
        iVar6 = acmod->n_senone_active;
        iVar5 = (int)sVar2;
      }
      piVar7 = piVar7 + bVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  else {
    pbVar3 = acmod->mdef;
    iVar6 = pbVar3->n_sen;
    if (iVar6 < 1) {
      return 0x7fff;
    }
    piVar7 = acmod->senone_scores;
    iVar5 = 0x7fff;
    lVar8 = 0;
    do {
      sVar2 = piVar7[lVar8];
      if (sVar2 < iVar5) {
        *out_best_senid = (int)lVar8;
        iVar6 = pbVar3->n_sen;
        iVar5 = (int)sVar2;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
  }
  return iVar5;
}

Assistant:

int
acmod_best_score(acmod_t *acmod, int *out_best_senid)
{
    int i, best;

    best = SENSCR_DUMMY;
    if (acmod->compallsen) {
        for (i = 0; i < bin_mdef_n_sen(acmod->mdef); ++i) {
            if (acmod->senone_scores[i] < best) {
                best = acmod->senone_scores[i];
                *out_best_senid = i;
            }
        }
    }
    else {
        int16 *senscr;
        senscr = acmod->senone_scores;
        for (i = 0; i < acmod->n_senone_active; ++i) {
            senscr += acmod->senone_active[i];
            if (*senscr < best) {
                best = *senscr;
                *out_best_senid = i;
            }
        }
    }
    return best;
}